

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_handlers.c
# Opt level: O1

dropt_error
dropt_handle_uint(dropt_context *context,dropt_option *option,dropt_char *optionArgument,void *dest)

{
  int iVar1;
  dropt_error dVar2;
  char *in_RAX;
  int *piVar3;
  ulong uVar4;
  uint uVar5;
  dropt_char *end;
  char *local_28;
  
  if (dest == (void *)0x0) {
    dropt_misuse("No handler destination specified.",
                 "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_handlers.c"
                 ,0x123);
    dVar2 = 2;
    uVar5 = 0;
  }
  else {
    dVar2 = 5;
    uVar5 = 0;
    if ((optionArgument != (dropt_char *)0x0) &&
       (uVar5 = (uint)(byte)*optionArgument, *optionArgument != 0)) {
      if (uVar5 == 0x2d) {
        dVar2 = 6;
        uVar5 = 0;
      }
      else {
        local_28 = in_RAX;
        piVar3 = __errno_location();
        *piVar3 = 0;
        uVar4 = strtoul(optionArgument,&local_28,10);
        uVar5 = 0;
        dVar2 = 6;
        if ((optionArgument < local_28) && (*local_28 == '\0')) {
          iVar1 = *piVar3;
          if (uVar4 >> 0x20 == 0 && iVar1 != 0x22) {
            dVar2 = (dropt_error)(iVar1 != 0);
            uVar5 = (uint)uVar4;
            if (iVar1 != 0) {
              uVar5 = 0;
            }
          }
          else {
            dVar2 = 7;
            uVar5 = 0xffffffff;
          }
        }
      }
    }
  }
  if (dVar2 == 0) {
    *(uint *)dest = uVar5;
  }
  return dVar2;
}

Assistant:

dropt_error
dropt_handle_uint(dropt_context* context,
                  const dropt_option* option,
                  const dropt_char* optionArgument,
                  void* dest)
{
    dropt_error err = dropt_error_none;
    int val = 0;
    unsigned int* out = dest;

    if (out == NULL)
    {
        DROPT_MISUSE("No handler destination specified.");
        err = dropt_error_bad_configuration;
    }
    else if (   optionArgument == NULL
             || optionArgument[0] == DROPT_TEXT_LITERAL('\0'))
    {
        err = dropt_error_insufficient_arguments;
    }
    else if (optionArgument[0] == DROPT_TEXT_LITERAL('-'))
    {
        err = dropt_error_mismatch;
    }
    else
    {
        dropt_char* end;
        unsigned long n;
        errno = 0;
        n = dropt_strtoul(optionArgument, &end, 10);

        /* Check that we matched at least one digit.
         * (`strtol`/`strtoul` will return 0 if fed a string with no digits.)
         */
        if (*end == DROPT_TEXT_LITERAL('\0') && end > optionArgument)
        {
            if (errno == ERANGE || n > UINT_MAX)
            {
                err = dropt_error_overflow;
                val = UINT_MAX;
            }
            else if (errno == 0)
            {
                val = (unsigned int) n;
            }
            else
            {
                err = dropt_error_unknown;
            }
        }
        else
        {
            err = dropt_error_mismatch;
        }
    }

    if (err == dropt_error_none) { *out = val; }
    return err;
}